

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

int __thiscall BpTree<float>::FindKey(BpTree<float> *this,float k,IndexNode<float> *C)

{
  uint uVar1;
  float *pfVar2;
  float fVar3;
  pointer pAVar4;
  pointer pcVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  Addr *pAVar10;
  size_t __n;
  bool bVar11;
  IndexNode<float> D;
  vector<float,_std::allocator<float>_> local_e8;
  _Vector_base<char,_std::allocator<char>_> local_d0;
  vector<Addr,_std::allocator<Addr>_> local_b8;
  Addr local_a0;
  Addr AStack_98;
  IndexNode<float> local_90;
  
  IndexNode<float>::IndexNode(&local_90,this->N);
  uVar7 = 0xffffffff;
  if ((this->RootAddr).FileOff != -1) {
    FindNode(this,this->RootAddr,C);
    if (C->NodeState != '1') {
      do {
        uVar7 = this->N - 1;
        uVar6 = 0;
        if (1 < this->N) {
          uVar6 = 0;
          do {
            if (((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6] != '1') ||
               (pfVar2 = (C->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar6, k < *pfVar2 || k == *pfVar2))
            goto LAB_0012c828;
            uVar6 = uVar6 + 1;
          } while (uVar7 != uVar6);
          uVar6 = (ulong)uVar7;
        }
LAB_0012c828:
        uVar8 = uVar6 & 0xffffffff;
        if (((uint)uVar6 == uVar7) ||
           ((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar8] == '0')) {
          lVar9 = uVar8 << 3;
LAB_0012c83c:
          pAVar10 = (Addr *)((long)&((C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                     super__Vector_impl_data._M_start)->BlockNum + lVar9);
LAB_0012c840:
          FindNode(this,*pAVar10,C);
        }
        else {
          fVar3 = (C->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8];
          if ((fVar3 == k) && (!NAN(fVar3) && !NAN(k))) {
            FindNode(this,(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar8],&local_90);
            std::vector<float,_std::allocator<float>_>::vector(&local_e8,&local_90.k);
            local_d0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_d0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_d0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
                      (&local_d0,
                       (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
            pcVar5 = local_d0._M_impl.super__Vector_impl_data._M_start;
            __n = (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
            if (__n != 0) {
              memmove(local_d0._M_impl.super__Vector_impl_data._M_start,
                      local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,__n);
            }
            local_d0._M_impl.super__Vector_impl_data._M_finish = pcVar5 + __n;
            std::vector<Addr,_std::allocator<Addr>_>::vector(&local_b8,&local_90.p);
            local_a0 = local_90.parent;
            AStack_98 = local_90.self;
            uVar7 = this->N - 1;
            uVar6 = 0;
            if (1 < this->N) {
              uVar6 = 0;
              do {
                if (local_d0._M_impl.super__Vector_impl_data._M_start[uVar6] != '1')
                goto LAB_0012c953;
                if ((local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar6] == k) &&
                   (!NAN(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar6]) && !NAN(k))) goto LAB_0012c953;
                uVar6 = uVar6 + 1;
              } while (uVar7 != uVar6);
              uVar6 = (ulong)uVar7;
            }
LAB_0012c953:
            bVar11 = true;
            if ((uint)uVar6 != uVar7) {
              bVar11 = local_d0._M_impl.super__Vector_impl_data._M_start[uVar6 & 0xffffffff] == '0';
            }
            if (local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage -
                              (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl
                                    .super__Vector_impl_data._M_start);
            }
            if (local_d0._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_d0._M_impl.super__Vector_impl_data._M_start,
                              (long)local_d0._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_d0._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_e8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            pAVar4 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (bVar11) {
              pAVar10 = pAVar4 + uVar8 + 1;
            }
            else {
              pAVar10 = pAVar4 + uVar8;
            }
            goto LAB_0012c840;
          }
          if (k < fVar3) {
            lVar9 = uVar8 * 8;
            goto LAB_0012c83c;
          }
        }
      } while (C->NodeState != '1');
    }
    uVar1 = this->N - 1;
    uVar6 = 0;
    if (1 < this->N) {
      uVar6 = 0;
      do {
        if ((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar6] != '1') goto LAB_0012c772;
        fVar3 = (C->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
        if ((fVar3 == k) && (!NAN(fVar3) && !NAN(k))) goto LAB_0012c772;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
      uVar6 = (ulong)uVar1;
    }
LAB_0012c772:
    uVar7 = 0xffffffff;
    if (((uint)uVar6 != uVar1) &&
       (uVar7 = 0xffffffff,
       (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start[uVar6 & 0xffffffff] != '0')) {
      uVar7 = (uint)uVar6;
    }
  }
  if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar7;
}

Assistant:

int BpTree<K>::FindKey(K k, IndexNode<K>& C) {
	IndexNode<K> D(N);
	int i;
	if (this->RootAddr.FileOff == -1)		return -1;	//����ǿ�����ֱ�ӷ���-1
	this->FindNode(this->RootAddr, C);
	while (C.NodeState != LEAF) {
		for (i = 0; i < N - 1 && C.v[i] == '1' && k > C.k[i]; i++);
		if (i == N - 1 || C.v[i] == '0') {
			this->FindNode(C.p[i], C);
		}
		else if (k == C.k[i]) {
			this->FindNode(C.p[i], D);
			if(this->HaveK(D, k))
				this->FindNode(C.p[i], C);			//���C.p[i]������k����C = this->FindNode(C.p[i]);
			else
				this->FindNode(C.p[i + 1], C);		//���C.p[i]������k����C = this->FindNode(C.p[i + 1]);
		}
		else if (k < C.k[i]) {
			this->FindNode(C.p[i], C);
		}
	}
	for (i = 0; i < N - 1 && C.v[i] == '1'&& k != C.k[i]; i++);
	if (i == N - 1 || C.v[i] == '0') {
		return -1;		//δ�ҵ�
	}
	else {
		return i;		//�ҵ���
	}
}